

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O0

void options_init_defaults(player_options *opts)

{
  int local_14;
  int opt;
  player_options *opts_local;
  
  for (local_14 = 0; local_14 < 0x2c; local_14 = local_14 + 1) {
    opts->opt[local_14] = (_Bool)(options[local_14].normal & 1);
  }
  options_restore_custom(opts,1);
  options_restore_custom(opts,0);
  opts->delay_factor = '(';
  opts->hitpoint_warn = '\x03';
  return;
}

Assistant:

void options_init_defaults(struct player_options *opts)
{
	/* Set defaults */
	int opt;
	for (opt = 0; opt < OPT_MAX; opt++)
		(*opts).opt[opt] = options[opt].normal;

	/* Override with the player's customizations. */
	options_restore_custom(opts, OP_BIRTH);
	options_restore_custom(opts, OP_INTERFACE);

	/* 40ms for the delay factor */
	(*opts).delay_factor = 40;

	/* 30% of HP */
	(*opts).hitpoint_warn = 3;
}